

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O0

bool __thiscall avro::BinaryDecoder::decodeBool(BinaryDecoder *this)

{
  ssize_t sVar1;
  Exception *this_00;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  uint8_t v;
  string *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  bool local_1;
  
  sVar1 = StreamReader::read((StreamReader *)(in_RDI + 8),in_ESI,in_RDX,in_RCX);
  if ((char)sVar1 == '\0') {
    local_1 = false;
  }
  else {
    if ((char)sVar1 != '\x01') {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      Exception::Exception(this_00,in_stack_ffffffffffffff98);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool BinaryDecoder::decodeBool()
{
    uint8_t v = in_.read();
    if (v == 0) {
        return false;
    } else if (v == 1) {
        return true;
    }
    throw Exception("Invalid value for bool");
}